

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tables.c
# Opt level: O3

int main(void)

{
  amqp_field_value_t v;
  amqp_field_value_t v_00;
  amqp_field_value_t v_01;
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  uint extraout_EAX_00;
  int extraout_EAX_01;
  FILE *pFVar3;
  FILE *__s;
  size_t sVar4;
  FILE *__s_00;
  int *piVar5;
  FILE *unaff_RBX;
  char *pcVar6;
  char *fmt;
  char *pcVar7;
  amqp_pool_t *pool;
  FILE *unaff_R15;
  amqp_bytes_t encoded;
  amqp_bytes_t encoded_00;
  undefined7 uStack_14ef;
  undefined4 uStack_14e4;
  undefined8 uStack_14d8;
  char *pcStack_14d0;
  undefined1 uStack_14c8;
  undefined8 uStack_14c0;
  char *pcStack_14b8;
  undefined8 uStack_14b0;
  char *pcStack_14a8;
  undefined1 uStack_14a0;
  undefined8 uStack_1498;
  char *pcStack_1490;
  undefined8 uStack_1488;
  char *pcStack_1480;
  undefined1 uStack_1478;
  undefined8 uStack_1470;
  char *pcStack_1468;
  undefined8 uStack_1460;
  char *pcStack_1458;
  undefined1 uStack_1450;
  undefined4 uStack_1448;
  undefined8 uStack_1438;
  char *pcStack_1430;
  undefined1 uStack_1428;
  undefined1 uStack_1420;
  undefined4 uStack_141c;
  undefined8 uStack_1410;
  char *pcStack_1408;
  undefined1 uStack_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13e8;
  char *pcStack_13e0;
  undefined1 uStack_13d8;
  undefined8 uStack_13d0;
  char *pcStack_13c8;
  undefined8 uStack_13c0;
  char *pcStack_13b8;
  undefined1 uStack_13b0;
  undefined8 uStack_13a8;
  char *pcStack_13a0;
  FILE *pFStack_1390;
  amqp_pool_t *paStack_1388;
  amqp_table_t aStack_1368;
  amqp_table_t aStack_1358;
  size_t sStack_1348;
  amqp_pool_t aStack_1340;
  undefined1 auStack_1300 [8];
  undefined4 uStack_12f8;
  undefined1 uStack_12e8;
  undefined8 uStack_12e0;
  char *pcStack_12d8;
  undefined8 uStack_12d0;
  char *pcStack_12c8;
  undefined1 uStack_12c0;
  undefined4 uStack_12b8;
  undefined8 uStack_12a8;
  char *pcStack_12a0;
  undefined1 uStack_1298;
  undefined8 uStack_1290;
  char *pcStack_1288;
  undefined1 auStack_1280 [40];
  undefined8 uStack_1258;
  char *pcStack_1250;
  undefined1 uStack_1248;
  undefined4 uStack_1240;
  undefined8 uStack_1230;
  char *pcStack_1228;
  undefined1 uStack_1220;
  undefined1 uStack_1218;
  undefined4 uStack_1214;
  undefined8 uStack_1208;
  char *pcStack_1200;
  undefined1 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e0;
  char *pcStack_11d8;
  undefined1 uStack_11d0;
  undefined4 uStack_11c8;
  undefined8 *puStack_11c0;
  undefined8 uStack_11b8;
  char *pcStack_11b0;
  undefined1 uStack_11a8;
  undefined1 uStack_11a0;
  undefined8 uStack_1190;
  char *pcStack_1188;
  undefined1 uStack_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1168;
  char *pcStack_1160;
  undefined1 uStack_1158;
  undefined2 uStack_1150;
  undefined8 uStack_1140;
  char *pcStack_1138;
  undefined1 uStack_1130;
  undefined4 uStack_1128;
  undefined8 uStack_1118;
  char *pcStack_1110;
  undefined1 uStack_1108;
  undefined8 uStack_1100;
  char *pcStack_10f8;
  undefined8 uStack_10f0;
  char *pcStack_10e8;
  undefined1 uStack_10e0;
  undefined8 uStack_10c8;
  char *pcStack_10c0;
  undefined1 uStack_10b8;
  undefined4 uStack_10b0;
  undefined1 *puStack_10a8;
  undefined8 uStack_10a0;
  char *pcStack_1098;
  undefined1 uStack_1090;
  undefined4 uStack_1088;
  undefined8 uStack_1078;
  char *pcStack_1070;
  undefined1 uStack_1068;
  undefined8 uStack_1060;
  amqp_pool_t aaStack_1050 [64];
  FILE *pFStack_48;
  FILE *pFStack_40;
  FILE *pFStack_38;
  
  pFVar3 = (FILE *)getenv("srcdir");
  __s = tmpfile();
  if (__s == (FILE *)0x0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    die("failed to create temporary file: %s",pcVar6);
LAB_00102551:
    __s_00 = pFVar3;
    pcVar6 = "out of memory";
  }
  else {
    test_table_codec((FILE *)__s);
    fwrite("----------\n",0xb,1,__s);
    test_dump_value((FILE *)__s);
    unaff_R15 = (FILE *)0x10d15e;
    if (pFVar3 != (FILE *)0x0) {
      unaff_R15 = pFVar3;
    }
    pFVar3 = (FILE *)strlen((char *)unaff_R15);
    pcVar6 = expected_file_name;
    sVar4 = strlen(expected_file_name);
    __s_00 = (FILE *)malloc((size_t)((long)&pFVar3->_flags + sVar4 + 2));
    unaff_RBX = __s;
    if (__s_00 == (FILE *)0x0) goto LAB_00102551;
    sprintf((char *)__s_00,"%s/%s",unaff_R15,pcVar6);
    pFVar3 = fopen((char *)__s_00,"r");
    if (pFVar3 == (FILE *)0x0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      die("failed to open %s: %s",__s_00,pcVar6);
    }
    else {
      iVar1 = compare_files((FILE *)pFVar3,(FILE *)__s);
      unaff_R15 = pFVar3;
      if (iVar1 == 0) {
        fclose(pFVar3);
        free(__s_00);
        fclose(__s);
        return 0;
      }
    }
    pcVar6 = "output file did not have expected contents";
  }
  die(pcVar6);
  puStack_11c0 = &uStack_12d0;
  uStack_12d0 = 3;
  pcStack_12c8 = "one";
  uStack_12c0 = 0x49;
  uStack_12b8 = 0xd431;
  uStack_12a8 = 3;
  pcStack_12a0 = "two";
  uStack_1298 = 0x53;
  uStack_1290 = 0xd;
  pcStack_1288 = "A long string";
  puStack_10a8 = auStack_1300;
  auStack_1300[0] = 0x49;
  uStack_12f8 = 0xd431;
  uStack_12e8 = 0x53;
  uStack_12e0 = 0xd;
  pcStack_12d8 = "A long string";
  aStack_1368.entries = (amqp_table_entry_t_ *)auStack_1280;
  auStack_1280._0_8_ = 7;
  auStack_1280._8_8_ = "longstr";
  auStack_1280[0x10] = 0x53;
  auStack_1280._24_8_ = 0x15;
  auStack_1280._32_8_ = "Here is a long string";
  uStack_1258 = 9;
  pcStack_1250 = "signedint";
  uStack_1248 = 0x49;
  uStack_1240 = 0x3039;
  uStack_1230 = 7;
  pcStack_1228 = "decimal";
  uStack_1220 = 0x44;
  uStack_1218 = 3;
  uStack_1214 = 0x1e240;
  uStack_1208 = 9;
  pcStack_1200 = "timestamp";
  uStack_11f8 = 0x54;
  uStack_11f0 = 0x63eea053c194;
  uStack_11e0 = 5;
  pcStack_11d8 = "table";
  uStack_11d0 = 0x46;
  uStack_11c8 = 2;
  uStack_11b8 = 4;
  pcStack_11b0 = "byte";
  uStack_11a8 = 0x62;
  uStack_11a0 = 0xff;
  uStack_1190 = 4;
  pcStack_1188 = "long";
  uStack_1180 = 0x6c;
  uStack_1178 = 0x499602d2;
  uStack_1168 = 5;
  pcStack_1160 = "short";
  uStack_1158 = 0x73;
  uStack_1150 = 0x28f;
  uStack_1140 = 4;
  pcStack_1138 = "bool";
  uStack_1130 = 0x74;
  uStack_1128 = 1;
  uStack_1118 = 6;
  pcStack_1110 = "binary";
  uStack_1108 = 0x78;
  uStack_1100 = 0xf;
  pcStack_10f8 = "a binary string";
  uStack_10f0 = 4;
  pcStack_10e8 = "void";
  uStack_10e0 = 0x56;
  uStack_10c8 = 5;
  pcStack_10c0 = "array";
  uStack_10b8 = 0x41;
  uStack_10b0 = 2;
  uStack_10a0 = 5;
  pcStack_1098 = "float";
  uStack_1090 = 0x66;
  uStack_1088 = 0x40490fdb;
  uStack_1078 = 6;
  pcStack_1070 = "double";
  uStack_1068 = 100;
  uStack_1060 = 0x400921fb54442d18;
  aStack_1368.num_entries = 0xe;
  paStack_1388 = (amqp_pool_t *)0x102869;
  pFStack_48 = unaff_RBX;
  pFStack_40 = __s_00;
  pFStack_38 = unaff_R15;
  fwrite("AAAAAAAAAA\n",0xb,1,(FILE *)pcVar6);
  aaStack_1050[0].pagesize._0_1_ = 0x46;
  aaStack_1050[0].pages._0_8_ = CONCAT44(aStack_1368._4_4_,aStack_1368.num_entries);
  aaStack_1050[0].pages.blocklist = (void **)aStack_1368.entries;
  v_00._1_7_ = aaStack_1050[0].pagesize._1_7_;
  v_00.kind = 0x46;
  paStack_1388 = (amqp_pool_t *)0x1028a1;
  v_00.value.i64 = aaStack_1050[0].pages._0_8_;
  v_00.value.bytes.bytes = aStack_1368.entries;
  dump_value(0,v_00,(FILE *)pcVar6);
  pool = &aStack_1340;
  paStack_1388 = (amqp_pool_t *)0x1028b3;
  init_amqp_pool(pool,0x1000);
  sStack_1348 = 0;
  paStack_1388 = (amqp_pool_t *)0x1028d8;
  encoded.bytes = pre_encoded_table;
  encoded.len = 0x103;
  iVar1 = amqp_decode_table(encoded,pool,&aStack_1358,&sStack_1348);
  if (iVar1 < 0) {
    paStack_1388 = (amqp_pool_t *)0x1029a7;
    pcVar7 = amqp_error_string2(iVar1);
    fmt = "Table decoding failed: %s";
LAB_001029be:
    paStack_1388 = (amqp_pool_t *)0x1029c8;
    die(fmt,pcVar7);
  }
  else {
    paStack_1388 = (amqp_pool_t *)0x1028f9;
    fwrite("BBBBBBBBBB\n",0xb,1,(FILE *)pcVar6);
    pool = aaStack_1050;
    aaStack_1050[0].pagesize._0_1_ = 0x46;
    aaStack_1050[0].pages.num_blocks = aStack_1358.num_entries;
    aaStack_1050[0].pages._4_4_ = aStack_1358._4_4_;
    aaStack_1050[0].pages.blocklist = (void **)aStack_1358.entries;
    v_01._1_7_ = aaStack_1050[0].pagesize._1_7_;
    v_01.kind = 0x46;
    paStack_1388 = (amqp_pool_t *)0x10292e;
    v_01.value.i64 = aStack_1358._0_8_;
    v_01.value.bytes.bytes = aStack_1358.entries;
    dump_value(0,v_01,(FILE *)pcVar6);
    aStack_1358._0_8_ = 0;
    paStack_1388 = (amqp_pool_t *)0x102944;
    memset(pool,0,0x1000);
    paStack_1388 = (amqp_pool_t *)0x102959;
    encoded_00.bytes = pool;
    encoded_00.len = 0x1000;
    iVar1 = amqp_encode_table(encoded_00,&aStack_1368,(size_t *)&aStack_1358);
    if (iVar1 < 0) {
      paStack_1388 = (amqp_pool_t *)0x1029b7;
      pcVar7 = amqp_error_string2(iVar1);
      fmt = "Table encoding failed: %s";
      goto LAB_001029be;
    }
    if (aStack_1358._0_8_ == 0x103) {
      paStack_1388 = (amqp_pool_t *)0x102984;
      uVar2 = memcmp(pre_encoded_table,aaStack_1050,0x103);
      if (uVar2 == 0) {
        paStack_1388 = (amqp_pool_t *)0x102992;
        empty_amqp_pool(&aStack_1340);
        return extraout_EAX;
      }
      goto LAB_001029db;
    }
  }
  paStack_1388 = (amqp_pool_t *)0x1029db;
  die("Offset should be %ld, was %ld",0x103);
  uVar2 = extraout_EAX_00;
LAB_001029db:
  pcVar7 = "Table encoding differed";
  paStack_1388 = (amqp_pool_t *)test_dump_value;
  die("Table encoding differed",(ulong)uVar2);
  uStack_14d8 = 5;
  pcStack_14d0 = "zebra";
  uStack_14c8 = 0x53;
  uStack_14c0 = 4;
  pcStack_14b8 = "last";
  uStack_14b0 = 8;
  pcStack_14a8 = "aardvark";
  uStack_14a0 = 0x53;
  uStack_1498 = 5;
  pcStack_1490 = "first";
  uStack_1488 = 6;
  pcStack_1480 = "middle";
  uStack_1478 = 0x53;
  uStack_1470 = 5;
  pcStack_1468 = "third";
  uStack_1460 = 6;
  pcStack_1458 = "number";
  uStack_1450 = 0x49;
  uStack_1448 = 0x4d2;
  uStack_1438 = 7;
  pcStack_1430 = "decimal";
  uStack_1428 = 0x44;
  uStack_1420 = 2;
  uStack_141c = 0x4d2;
  uStack_1410 = 4;
  pcStack_1408 = "time";
  uStack_1400 = 0x54;
  uStack_13f8 = 0x4626dbf9a01f2;
  uStack_13e8 = 4;
  pcStack_13e0 = "beta";
  uStack_13d8 = 0x53;
  uStack_13d0 = 6;
  pcStack_13c8 = "second";
  uStack_13c0 = 6;
  pcStack_13b8 = "wombat";
  uStack_13b0 = 0x53;
  uStack_13a8 = 6;
  pcStack_13a0 = "fourth";
  pFStack_1390 = (FILE *)pcVar6;
  paStack_1388 = pool;
  qsort(&uStack_14d8,8,0x28,amqp_table_entry_cmp);
  v._1_7_ = uStack_14ef;
  v.kind = 0x46;
  v.value.decimal.value = uStack_14e4;
  v.value.boolean = 8;
  v.value.bytes.bytes = &uStack_14d8;
  dump_value(0,v,(FILE *)pcVar7);
  return extraout_EAX_01;
}

Assistant:

int main(void) {
  char *srcdir = getenv("srcdir");
  FILE *out, *expected = NULL;
  char *expected_path;

  out = tmpfile();
  if (out == NULL) {
    die("failed to create temporary file: %s", strerror(errno));
  }

  test_table_codec(out);
  fprintf(out, "----------\n");
  test_dump_value(out);

  if (srcdir == NULL) {
    srcdir = ".";
  }

  expected_path = malloc(strlen(srcdir) + strlen(expected_file_name) + 2);
  if (!expected_path) {
    die("out of memory");
  }
  sprintf(expected_path, "%s/%s", srcdir, expected_file_name);
  expected = fopen(expected_path, "r");
  if (!expected) {
    die("failed to open %s: %s", expected_path, strerror(errno));
  }

  if (compare_files(expected, out)) {
    die("output file did not have expected contents");
  }

  fclose(expected);
  free(expected_path);
  fclose(out);

  return 0;
}